

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_object.cpp
# Opt level: O2

vector<duckdb::AggregateObject,_true> *
duckdb::AggregateObject::CreateAggregateObjects
          (vector<duckdb::AggregateObject,_true> *__return_storage_ptr__,
          vector<duckdb::BoundAggregateExpression_*,_true> *bindings)

{
  pointer ppBVar1;
  BoundAggregateExpression **binding;
  pointer __args;
  
  (__return_storage_ptr__->
  super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>).
  super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>).
  super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>).
  super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>::reserve
            (&__return_storage_ptr__->
              super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>,
             (long)(bindings->
                   super_vector<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
                   ).
                   super__Vector_base<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(bindings->
                   super_vector<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
                   ).
                   super__Vector_base<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  ppBVar1 = (bindings->
            super_vector<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
            ).
            super__Vector_base<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (__args = (bindings->
                super_vector<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
                ).
                super__Vector_base<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
                ._M_impl.super__Vector_impl_data._M_start; __args != ppBVar1; __args = __args + 1) {
    ::std::vector<duckdb::AggregateObject,std::allocator<duckdb::AggregateObject>>::
    emplace_back<duckdb::BoundAggregateExpression*const&>
              ((vector<duckdb::AggregateObject,std::allocator<duckdb::AggregateObject>> *)
               __return_storage_ptr__,__args);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<AggregateObject> AggregateObject::CreateAggregateObjects(const vector<BoundAggregateExpression *> &bindings) {
	vector<AggregateObject> aggregates;
	aggregates.reserve(bindings.size());
	for (auto &binding : bindings) {
		aggregates.emplace_back(binding);
	}
	return aggregates;
}